

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

uchar MemGetByte(uint address)

{
  uint uVar1;
  CDeviceSlot *pCVar2;
  int num;
  
  if ((DeviceID != (char *)0x0) && (pass == 3)) {
    for (num = 0; num < Device->SlotsCount; num = num + 1) {
      pCVar2 = CDevice::GetSlot(Device,num);
      uVar1 = pCVar2->Address;
      if ((uVar1 <= address) && (address < uVar1 + pCVar2->Size)) {
        return pCVar2->Page->RAM[address - uVar1];
      }
    }
    ErrorInt("MemGetByte: Error reading address",address,PASS3);
  }
  return '\0';
}

Assistant:

unsigned char MemGetByte(unsigned int address) {
	if (!DeviceID || pass != LASTPASS) {
		return 0;
	}

	CDeviceSlot* S;
	for (int i=0;i<Device->SlotsCount;i++) {
		S = Device->GetSlot(i);
		if (address >= (unsigned int)S->Address  && address < (unsigned int)S->Address + (unsigned int)S->Size) {
			return S->Page->RAM[address - S->Address];
		}
	}

	ErrorInt("MemGetByte: Error reading address", address);
	return 0;
}